

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

bool __thiscall BinNE<0,_0,_0>::propagate(BinNE<0,_0,_0> *this)

{
  IntView<0> *this_00;
  int iVar1;
  IntVar *pIVar2;
  IntVar *pIVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  long lVar8;
  int64_t m_v;
  
  this_00 = &this->x;
  pIVar2 = (this->x).var;
  iVar5 = (pIVar2->min).v;
  iVar7 = (pIVar2->max).v;
  if (iVar5 == iVar7) {
    pIVar3 = (this->y).var;
    iVar1 = (pIVar3->min).v;
    iVar7 = iVar5;
    if (((iVar5 == iVar1) && (iVar1 == (pIVar3->max).v)) &&
       ((uint)(this->r).s * 2 + -1 != (int)sat.assigns.data[(uint)(this->r).v])) {
      if (so.lazy) {
        iVar5 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[10])();
        uVar6 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[10])();
        r._a = (ulong)uVar6 << 0x20 | (long)iVar5 << 2 | 3;
      }
      else {
        r._pt = (Clause *)0x0;
      }
      bVar4 = BoolView::setVal(&this->r,false,(Reason)r);
      if (!bVar4) {
        return false;
      }
      iVar5 = (this_00->var->min).v;
      iVar7 = (this_00->var->max).v;
      goto LAB_00191d20;
    }
  }
  else {
LAB_00191d20:
    if (iVar5 != iVar7) goto LAB_00191d77;
  }
  bVar4 = IntView<0>::indomain(&this->y,(long)iVar7);
  if (bVar4) {
    if (so.lazy == true) {
      iVar5 = (*(this_00->var->super_Var).super_Branching._vptr_Branching[10])();
      lVar8 = (long)iVar5 * 4 + 2;
    }
    else {
      lVar8 = 0;
    }
    pIVar2 = (this->y).var;
    iVar5 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0x11])(pIVar2,(long)iVar7,lVar8,1)
    ;
    if ((char)iVar5 == '\0') {
      return false;
    }
  }
LAB_00191d77:
  pIVar2 = (this->y).var;
  iVar5 = (pIVar2->min).v;
  if (iVar5 != (pIVar2->max).v) {
    return true;
  }
  bVar4 = IntView<0>::indomain(this_00,(long)iVar5);
  if (bVar4) {
    if (so.lazy == true) {
      iVar7 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[10])();
      lVar8 = (long)iVar7 * 4 + 2;
    }
    else {
      lVar8 = 0;
    }
    iVar5 = (*(this_00->var->super_Var).super_Branching._vptr_Branching[0x11])
                      (this_00->var,(long)iVar5,lVar8,1);
    if ((char)iVar5 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		if (x.isFixed() && y.isFixed() && x.getVal() == y.getVal()) {
			setDom(r, setVal, 0, x.getValLit(), y.getValLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		if (x.isFixed()) {
			if (R != 0) {
				setDom(y, remVal, x.getVal(), x.getValLit(), r.getValLit());
			} else {
				setDom(y, remVal, x.getVal(), x.getValLit());
			}
		}
		if (y.isFixed()) {
			if (R != 0) {
				setDom(x, remVal, y.getVal(), y.getValLit(), r.getValLit());
			} else {
				setDom(x, remVal, y.getVal(), y.getValLit());
			}
		}

		return true;
	}